

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

void openjtalk_speakSyncSjis(OpenJTalk *oj,char *text)

{
  SpeakData *pSVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  undefined8 uStack_40;
  int aiStack_38 [4];
  undefined8 uStack_28;
  undefined8 uStack_20;
  
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
    return;
  }
  uStack_20 = 0x143eb1;
  openjtalk_stop(oj);
  uStack_20 = 0x143ebc;
  synthesisSjis(oj,text);
  if (g_psd->length == 0) {
    return;
  }
  if (g_verbose == true) {
    speak_sync_cold_1();
  }
  pSVar1 = g_psd;
  g_psd->finished = false;
  pSVar1->stop = false;
  pSVar1->pause = false;
  pSVar1->speaking = false;
  pSVar1->paused = false;
  aiStack_38[0] = Pa_GetDefaultOutputDevice();
  if (aiStack_38[0] != -1) {
    aiStack_38[1] = 1;
    aiStack_38[2] = 8;
    aiStack_38[3] = 0;
    lVar3 = Pa_GetDeviceInfo(aiStack_38[0]);
    uStack_28 = *(undefined8 *)(lVar3 + 0x28);
    uStack_20 = 0;
    iVar2 = Pa_OpenStream(((double)CONCAT44(0x45300000,(int)(g_psd->sampling_frequency >> 0x20)) -
                          1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)g_psd->sampling_frequency) -
                          4503599627370496.0),&uStack_40,0,aiStack_38,0x400,1,0,0);
    if (iVar2 == 0) {
      g_psd->speaking = true;
      iVar2 = Pa_StartStream(uStack_40);
      if (iVar2 == 0) {
        if (g_psd->length != 0) {
          uVar4 = 0x400;
          uVar5 = 0;
          do {
            if ((g_psd->stop != false) ||
               (iVar2 = Pa_WriteStream(uStack_40,g_psd->data + uVar5,0x400), iVar2 != 0)) break;
            uVar5 = (ulong)uVar4;
            uVar4 = uVar4 + 0x400;
          } while (uVar5 < g_psd->length);
        }
        Pa_CloseStream(uStack_40);
      }
    }
  }
  if (g_psd->data != (short *)0x0) {
    free(g_psd->data);
    g_psd->data = (short *)0x0;
  }
  pSVar1 = g_psd;
  g_psd->finished = true;
  pSVar1->stop = false;
  pSVar1->pause = false;
  pSVar1->speaking = false;
  pSVar1->paused = false;
  if (g_verbose == true) {
    speak_sync_cold_2();
  }
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_speakSyncSjis(OpenJTalk *oj, const char *text)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}
	openjtalk_stop(oj);
	synthesisSjis(oj, text);
	if (g_psd->length != 0)
	{
		speak_sync(oj);
	}
}